

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sopr.cc
# Opt level: O1

void anon_unknown.dwarf_5d83::PrintTypeErrorMessage(char *option)

{
  size_t sVar1;
  ostringstream error_message;
  string local_1a8;
  long local_188 [14];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"The argument for the -",0x16);
  if (option == (char *)0x0) {
    std::ios::clear((int)&local_1a8 + (int)*(undefined8 *)(local_188[0] + -0x18) + 0x20);
  }
  else {
    sVar1 = strlen(option);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,option,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188," option must be numeric",0x17);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"sopr","");
  sptk::PrintErrorMessage(&local_1a8,(ostringstream *)local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void PrintTypeErrorMessage(const char* option) {
  std::ostringstream error_message;
  error_message << "The argument for the -" << option
                << " option must be numeric";
  sptk::PrintErrorMessage("sopr", error_message);
}